

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

us_listen_socket_t *
us_socket_context_listen
          (int ssl,us_socket_context_t *context,char *host,int port,int options,int socket_ext_size)

{
  addrinfo **ppaVar1;
  us_socket_t *puVar2;
  int iVar3;
  int __fd;
  uint uVar4;
  us_listen_socket_t *puVar5;
  addrinfo *__req;
  addrinfo *paVar6;
  bool bVar7;
  addrinfo *result;
  int enabled;
  int disabled;
  char port_string [16];
  addrinfo hints;
  addrinfo *local_90;
  uint local_84;
  undefined4 local_80;
  undefined4 local_7c;
  char local_78 [16];
  addrinfo local_68;
  
  if (ssl != 0) {
    puVar5 = us_internal_ssl_socket_context_listen
                       ((us_internal_ssl_socket_context_t *)context,host,port,options,
                        socket_ext_size);
    return puVar5;
  }
  __req = &local_68;
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_flags = 1;
  local_68.ai_family = 0;
  local_68.ai_socktype = 1;
  local_68.ai_protocol = 0;
  local_84 = socket_ext_size;
  snprintf(local_78,0x10,"%d");
  iVar3 = getaddrinfo(host,local_78,__req,&local_90);
  __fd = -1;
  paVar6 = local_90;
  if (iVar3 == 0) {
    for (; paVar6 != (addrinfo *)0x0; paVar6 = paVar6->ai_next) {
      __fd = -1;
      if (paVar6->ai_family == 10) {
        __fd = socket(10,paVar6->ai_socktype | 0x80800,paVar6->ai_protocol);
        uVar4 = fcntl(__fd,3,0);
        fcntl(__fd,4,(ulong)(uVar4 | 0x800));
        __req = paVar6;
      }
      if (__fd != -1) break;
    }
    bVar7 = __fd == -1;
    paVar6 = local_90;
    if (bVar7 && local_90 != (addrinfo *)0x0) {
      do {
        __fd = -1;
        if (paVar6->ai_family == 2) {
          __fd = socket(2,paVar6->ai_socktype | 0x80800,paVar6->ai_protocol);
          uVar4 = fcntl(__fd,3,0);
          fcntl(__fd,4,(ulong)(uVar4 | 0x800));
          __req = paVar6;
        }
        bVar7 = __fd == -1;
      } while ((bVar7) &&
              (ppaVar1 = &paVar6->ai_next, paVar6 = *ppaVar1, *ppaVar1 != (addrinfo *)0x0));
    }
    if (bVar7) {
      freeaddrinfo(local_90);
      __fd = -1;
    }
    else {
      if ((options & 1U) == 0) {
        local_80 = 1;
        setsockopt(__fd,1,0xf,&local_80,4);
      }
      local_80 = 1;
      setsockopt(__fd,1,2,&local_80,4);
      local_7c = 0;
      setsockopt(__fd,0x29,0x1a,&local_7c,4);
      iVar3 = bind(__fd,__req->ai_addr,__req->ai_addrlen);
      if ((iVar3 != 0) || (iVar3 = listen(__fd,0x200), iVar3 != 0)) {
        close(__fd);
        __fd = -1;
      }
      freeaddrinfo(local_90);
    }
  }
  if (__fd == -1) {
    puVar5 = (us_listen_socket_t *)0x0;
  }
  else {
    puVar5 = (us_listen_socket_t *)us_create_poll(context->loop,0,0x40);
    us_poll_init((us_poll_t *)puVar5,__fd,2);
    us_poll_start((us_poll_t *)puVar5,context->loop,1);
    (puVar5->s).context = context;
    (puVar5->s).timeout = 0;
    (puVar5->s).next = (us_socket_t *)0x0;
    puVar2 = context->head;
    (puVar5->s).next = puVar2;
    (puVar5->s).prev = (us_socket_t *)0x0;
    if (puVar2 != (us_socket_t *)0x0) {
      puVar2->prev = (us_socket_t *)puVar5;
    }
    context->head = (us_socket_t *)puVar5;
    puVar5->socket_ext_size = local_84;
  }
  return puVar5;
}

Assistant:

struct us_listen_socket_t *us_socket_context_listen(int ssl, struct us_socket_context_t *context, const char *host, int port, int options, int socket_ext_size) {
#ifndef LIBUS_NO_SSL
    if (ssl) {
        return us_internal_ssl_socket_context_listen((struct us_internal_ssl_socket_context_t *) context, host, port, options, socket_ext_size);
    }
#endif

    LIBUS_SOCKET_DESCRIPTOR listen_socket_fd = bsd_create_listen_socket(host, port, options);

    if (listen_socket_fd == LIBUS_SOCKET_ERROR) {
        return 0;
    }

    struct us_poll_t *p = us_create_poll(context->loop, 0, sizeof(struct us_listen_socket_t));
    us_poll_init(p, listen_socket_fd, POLL_TYPE_SEMI_SOCKET);
    us_poll_start(p, context->loop, LIBUS_SOCKET_READABLE);

    struct us_listen_socket_t *ls = (struct us_listen_socket_t *) p;

    ls->s.context = context;
    ls->s.timeout = 0;
    ls->s.next = 0;
    us_internal_socket_context_link(context, &ls->s);

    ls->socket_ext_size = socket_ext_size;

    return ls;
}